

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

uint8_t * __thiscall
cdns::dump_block_properties
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int cdns_version,
          int *err,FILE *F_out)

{
  byte bVar1;
  long lVar2;
  byte *in_00;
  uint8_t *in_01;
  size_t __n;
  int iVar3;
  size_t __size;
  cdns *pcVar4;
  char *__ptr;
  int64_t val;
  int local_64;
  char *local_60;
  char *local_58;
  int64_t inner_val;
  char *p_out;
  int64_t local_40;
  cdns *local_38;
  
  bVar1 = *in;
  local_64 = cdns_version;
  local_60 = out_buf;
  local_58 = out_max;
  local_38 = this;
  in_00 = cbor_get_number(in,in_max,&val);
  if (bVar1 >> 5 == 5 && in_00 != (byte *)0x0) {
    fwrite("        [\n",10,1,(FILE *)F_out);
    local_40 = val;
    if (val == -1) {
      val = 0xffffffff;
    }
    iVar3 = 0;
    while (((in_00 < in_max && (in_00 != (byte *)0x0)) && (0 < val))) {
      bVar1 = *in_00;
      if (bVar1 == 0xff) {
        fwrite("\n            --end of array",0x1b,1,(FILE *)F_out);
        if (local_40 == -1) {
          in_00 = in_00 + 1;
          goto LAB_0017ba78;
        }
        fwrite("            Error, end of array mark unexpected.\n",0x31,1,(FILE *)F_out);
        *err = -3;
        goto LAB_0017ba70;
      }
      in_01 = cbor_get_number(in_00,in_max,&inner_val);
      if (bVar1 < 0x20) {
        if (iVar3 != 0) {
          fwrite(",\n",2,1,(FILE *)F_out);
        }
        fprintf((FILE *)F_out,"            %d, ",(ulong)(uint)inner_val);
        __ptr = local_60;
        lVar2 = CONCAT44(inner_val._4_4_,(uint)inner_val);
        if (lVar2 == 4) {
          pcVar4 = (cdns *)0x1a065b;
          fwrite("[\n",2,1,(FILE *)F_out);
          in_00 = dump_list(pcVar4,in_01,in_max,local_60,local_58,"                ",
                            "address-event-counts",err,F_out);
LAB_0017b9ce:
          __n = 1;
          __ptr = "            ]";
          __size = 0xd;
LAB_0017ba13:
          fwrite(__ptr,__size,__n,(FILE *)F_out);
        }
        else {
          if (lVar2 == 3) {
            pcVar4 = (cdns *)0x1a065b;
            fwrite("[\n",2,1,(FILE *)F_out);
            in_00 = dump_queries(pcVar4,in_01,in_max,local_60,local_58,local_64,err,F_out);
            goto LAB_0017b9ce;
          }
          if (lVar2 != 2) {
            p_out = local_60;
            in_00 = cbor_to_text(in_01,in_max,&p_out,local_58,err);
            __n = (long)p_out - (long)__ptr;
            __size = 1;
            goto LAB_0017ba13;
          }
          in_00 = dump_block_tables(local_38,in_01,in_max,local_60,local_58,local_64,err,F_out);
        }
        iVar3 = iVar3 + 1;
        val = val + -1;
      }
      else {
        fprintf((FILE *)F_out,"            Unexpected type: %d(%d)\n",(ulong)(bVar1 >> 5),
                (ulong)(uint)inner_val);
        *err = -3;
        in_00 = (byte *)0x0;
      }
    }
    if (in_00 == (byte *)0x0) {
LAB_0017ba70:
      in_00 = (byte *)0x0;
    }
    else {
LAB_0017ba78:
      fwrite("\n        ]\n",0xb,1,(FILE *)F_out);
    }
  }
  else {
    in_00 = (byte *)0x0;
    fprintf((FILE *)F_out,"   Error, cannot parse the first bytes of properties, type: %d.\n",
            (ulong)(bVar1 >> 5));
    *err = -3;
  }
  return in_00;
}

Assistant:

uint8_t* cdns::dump_block_properties(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int cdns_version, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in == NULL || outer_type != CBOR_T_MAP) {
        fprintf(F_out, "   Error, cannot parse the first bytes of properties, type: %d.\n", outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }
    else {
        int rank = 0;
        fprintf(F_out, "        [\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max ) {
            if (*in == 0xff) {
                fprintf(F_out, "\n            --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "            Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "            Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    fprintf(F_out, "            %d, ", (int)inner_val);
                    if (inner_val == 2) {
                        in = dump_block_tables(in, in_max, out_buf, out_max, cdns_version, err, F_out);
                    }
                    else if (inner_val == 3) {
                        fprintf(F_out, "[\n");
                        in = dump_queries(in, in_max, out_buf, out_max, cdns_version, err, F_out);
                        fprintf(F_out, "            ]");
                    }
                    else if (inner_val == 4) {
                        fprintf(F_out, "[\n");
                        in = dump_list(in, in_max, out_buf, out_max, "                ", "address-event-counts", err, F_out);
                        fprintf(F_out, "            ]");
                    }
                    else {
                        p_out = out_buf;
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }

        if (in != NULL) {
            fprintf(F_out, "\n        ]\n");
        }
    }

    return in;
}